

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O2

longlong valence(char c)

{
  undefined3 in_register_00000039;
  int iVar1;
  undefined8 uStack_8;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  if (iVar1 == 0x2e) {
    uStack_8 = -1;
  }
  else if (iVar1 == 0x4f) {
    uStack_8 = 2;
  }
  else if (iVar1 == 0x4e) {
    uStack_8 = 3;
  }
  else if (iVar1 == 0x48) {
    uStack_8 = 1;
  }
  else {
    uStack_8 = 4;
  }
  return uStack_8;
}

Assistant:

long long valence(char c){
    if(c == '.') {
        return -1;
    }
    if(c == 'H') {
        return 1;
    }
    if(c == 'O') {
        return 2;
    }
    if(c == 'N') {
        return 3;
    }
    return 4;
}